

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_estimateBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,size_t nbSeq,uint maxCode,
                 FSE_CTable *fseCTable,U8 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  uint *count;
  ulong uVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint max;
  undefined4 in_stack_0000001c;
  uint local_34;
  
  count = (uint *)CONCAT44(in_stack_0000001c,defaultMax);
  local_34 = maxCode;
  HIST_countFast_wksp(count,&local_34,codeTable,nbSeq,count,0x22d8);
  if (type == set_rle) {
LAB_01f60156:
    uVar1 = 0;
  }
  else {
    if (type == set_basic) {
      uVar1 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,count,local_34);
    }
    else {
      if ((type & ~set_rle) != set_compressed) goto LAB_01f60156;
      uVar1 = ZSTD_fseBitCost(fseCTable,count,local_34);
    }
    if (0xffffffffffffff88 < uVar1) {
      return nbSeq * 10;
    }
  }
  pbVar3 = codeTable + nbSeq;
  for (; codeTable < pbVar3; codeTable = codeTable + 1) {
    pbVar2 = codeTable;
    if (additionalBits != (U8 *)0x0) {
      pbVar2 = additionalBits + *codeTable;
    }
    uVar1 = uVar1 + *pbVar2;
  }
  return uVar1 >> 3;
}

Assistant:

static size_t
ZSTD_estimateBlockSize_symbolType(symbolEncodingType_e type,
                    const BYTE* codeTable, size_t nbSeq, unsigned maxCode,
                    const FSE_CTable* fseCTable,
                    const U8* additionalBits,
                    short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                    void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        (void)defaultMax;
        cSymbolTypeSizeEstimateInBits = ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) {
        return nbSeq * 10;
    }
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits >> 3;
}